

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsDemuxer.cpp
# Opt level: O2

void __thiscall TSDemuxer::openFile(TSDemuxer *this,string *streamName)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 *puVar4;
  uint *local_1d8;
  undefined8 local_1d0;
  uint local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  string local_1b8;
  ostringstream ss;
  
  std::__cxx11::string::_M_assign((string *)&this->m_streamName);
  unquoteStr(&local_1b8,streamName);
  strToLowerCase((string *)&ss,&local_1b8);
  std::__cxx11::string::operator=((string *)&this->m_streamNameLow,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::
  _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
  ::clear(&(this->m_lastPesPts)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
  ::clear(&(this->m_lastPesDts)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
  ::clear(&(this->m_fullPtsTime)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
  ::clear(&(this->m_fullDtsTime)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
  ::clear(&(this->m_firstPtsTime)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
  ::clear(&(this->m_firstDtsTime)._M_t);
  this->m_firstPCRTime = -1;
  this->m_lastPCRVal = -1;
  bVar1 = isM2TSExt(streamName);
  this->m_m2tsMode = bVar1;
  iVar2 = (*this->m_bufferedReader->_vptr_AbstractReader[8])
                    (this->m_bufferedReader,(ulong)(uint)this->m_readerID,
                     (this->m_streamName)._M_dataplus._M_p,0,0);
  if ((char)iVar2 != '\0') {
    this->m_pmtPid = -1;
    this->m_codecReady = false;
    this->m_readCnt = 0;
    this->m_dataProcessed = 0;
    this->m_notificated = false;
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar3 = std::operator<<((ostream *)&ss,"Can\'t open stream ");
  std::operator<<(poVar3,(string *)&this->m_streamName);
  puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar4 = 100;
  *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
  if (local_1d8 == &local_1c8) {
    puVar4[6] = local_1c8;
    puVar4[7] = uStack_1c4;
    puVar4[8] = uStack_1c0;
    puVar4[9] = uStack_1bc;
  }
  else {
    *(uint **)(puVar4 + 2) = local_1d8;
    *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1c4,local_1c8);
  }
  *(undefined8 *)(puVar4 + 4) = local_1d0;
  local_1c8 = local_1c8 & 0xffffff00;
  __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

void TSDemuxer::openFile(const std::string& streamName)
{
    m_streamName = streamName;
    m_streamNameLow = strToLowerCase(unquoteStr(streamName));
    readClose();
    m_lastPesPts.clear();
    m_lastPesDts.clear();
    m_fullPtsTime.clear();
    m_fullDtsTime.clear();
    m_firstPtsTime.clear();
    m_firstDtsTime.clear();
    m_firstPCRTime = -1;
    m_lastPCRVal = -1;

    m_m2tsMode = isM2TSExt(streamName);

    if (!m_bufferedReader->openStream(m_readerID, m_streamName.c_str()))
        THROW(ERR_FILE_NOT_FOUND, "Can't open stream " << m_streamName)

    m_pmtPid = -1;
    m_codecReady = false;
    m_readCnt = 0;
    m_dataProcessed = 0;
    m_notificated = false;
}